

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitalClock.cpp
# Opt level: O3

void __thiscall DigitalClock::Draw(DigitalClock *this)

{
  int iVar1;
  int iVar2;
  ostream *this_00;
  long *plVar3;
  
  iVar1 = (**(code **)(*(long *)this->_subject + 0x28))();
  iVar2 = (**(code **)(*(long *)this->_subject + 0x30))();
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
  plVar3 = (long *)std::ostream::operator<<(this_00,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void DigitalClock::Draw () {
    // get the new values from the subject

    int hour = _subject->GetHour();
    int minute = _subject->GetMinute();
    // etc.

    // draw the digital clock
    std::cout << hour << ":" << minute << std::endl;
}